

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bels.c
# Opt level: O0

err_t belsGenMi(octet *mi,size_t len,octet *m0,gen_i ang,void *ang_state)

{
  bool_t bVar1;
  int iVar2;
  ulong n_00;
  void *src;
  word *b;
  word *a;
  code *in_RCX;
  void *stack_00;
  word *in_RDX;
  size_t in_RSI;
  void *in_RDI;
  word *in_R8;
  void *stack;
  word *f;
  word *u;
  word *f0;
  void *state;
  err_t code;
  size_t reps;
  size_t n;
  size_t in_stack_ffffffffffffff90;
  u64 *dest;
  err_t local_44;
  void *pvVar3;
  err_t local_4;
  
  if (in_RCX == (code *)0x0) {
    local_4 = 0x131;
  }
  else if ((((in_RSI == 0x10) || (in_RSI == 0x18)) || (in_RSI == 0x20)) &&
          ((bVar1 = memIsValid(in_RDX,in_RSI), bVar1 != 0 &&
           (bVar1 = memIsValid(in_RDI,in_RSI), bVar1 != 0)))) {
    n_00 = in_RSI + 7 >> 3;
    src = (void *)((n_00 * 2 + 2) * 8);
    ppMinPolyMod_deep(in_stack_ffffffffffffff90);
    b = (word *)blobCreate((size_t)src);
    if (b == (word *)0x0) {
      local_4 = 0x6e;
    }
    else {
      a = b + n_00 + 1;
      dest = a + n_00 + 1;
      u64From(dest,src,0x145cd9);
      b[n_00] = 1;
      pvVar3 = (void *)0x3;
      do {
        stack_00 = (void *)((long)pvVar3 + -1);
        if (pvVar3 == (void *)0x0) goto LAB_00145db2;
        (*in_RCX)(a,in_RSI,in_R8);
        u64From(dest,src,0x145d39);
        a[n_00] = 0;
        ppMinPolyMod(in_RDX,(word *)in_RCX,in_R8,n_00,stack_00);
        pvVar3 = stack_00;
      } while ((a[n_00] != 1) || (iVar2 = wwCmp(a,b,n_00), pvVar3 = stack_00, iVar2 == 0));
      u64To(dest,(size_t)src,(u64 *)0x145dab);
LAB_00145db2:
      if (stack_00 == (void *)0xffffffffffffffff) {
        bVar1 = wwEq(a,b,n_00 + 1);
        if (bVar1 == 0) {
          local_44 = 0x1f9;
        }
        else {
          local_44 = 0x131;
        }
      }
      else {
        local_44 = 0;
      }
      blobClose((blob_t)0x145dff);
      local_4 = local_44;
    }
  }
  else {
    local_4 = 0x6d;
  }
  return local_4;
}

Assistant:

err_t belsGenMi(octet mi[], size_t len, const octet m0[], gen_i ang, 
	void* ang_state)
{
	size_t n, reps;
	err_t code;
	void* state;
	word* f0;
	word* u;
	word* f;
	void* stack;
	// проверить генератор
	if (ang == 0)
		return ERR_BAD_ANG;
	// проверить входные данные
	if ((len != 16 && len != 24 && len != 32) || 
		!memIsValid(m0, len) || !memIsValid(mi, len))
		return ERR_BAD_INPUT;
	EXPECT(belsValM(m0, len) == ERR_OK);
	// создать состояние
	n = W_OF_O(len);
	state = blobCreate(O_OF_W(2 * n + 2) + ppMinPolyMod_deep(n + 1));
	if (state == 0)
		return ERR_OUTOFMEMORY;
	// раскладка состояния
	f0 = (word*)state;
	f = f0 + n + 1;
	u = f;
	stack = f + n + 1;
	// загрузить многочлен
	wwFrom(f0, m0, len);
	f0[n] = 1;
	// попытки генерации
	for (reps = 3; reps--; )
	{
		ang(u, len, ang_state);
		wwFrom(u, u, len), u[n] = 0;
		// f <- минимальный многочлен элемента u
		ppMinPolyMod(f, u, f0, n + 1, stack);
		// f подходит?
		if (f[n] == 1 && wwCmp(f, f0, n) != 0)
		{
			wwTo(mi, len, f);
			break;
		}
	}
	// завершение
	if (reps != SIZE_MAX)
		code = ERR_OK;
	else if (wwEq(f, f0, n + 1))
		code = ERR_BAD_ANG;
	else 
		code = ERR_BAD_PUBKEY;
	blobClose(state);
	return code;
}